

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdialog.cpp
# Opt level: O3

void QDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  undefined4 uVar2;
  code *UNRECOVERED_JUMPTABLE;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_2c = *_a[1];
      local_20 = &local_2c;
      local_28 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        iVar3 = 1;
LAB_004d9c72:
        QMetaObject::activate(_o,&staticMetaObject,iVar3,(void **)0x0);
        return;
      }
      goto LAB_004d9cc6;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        iVar3 = 2;
        goto LAB_004d9c72;
      }
      goto LAB_004d9cc6;
    case 3:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x1a0);
      goto LAB_004d9caf;
    case 4:
      uVar2 = (**(code **)(*(long *)_o + 0x1a8))();
      if ((undefined4 *)*_a != (undefined4 *)0x0) {
        *(undefined4 *)*_a = uVar2;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        (**(code **)(*(long *)_o + 0x1b0))(_o,*_a[1]);
        return;
      }
      goto LAB_004d9cc6;
    case 6:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x1b8);
      goto LAB_004d9caf;
    case 7:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x1c0);
LAB_004d9caf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        (*UNRECOVERED_JUMPTABLE)();
        return;
      }
      goto LAB_004d9cc6;
    }
    break;
  case ReadProperty:
    if (_id == 1) {
      bVar4 = (*(uint *)(*(long *)(_o + 0x20) + 0x10) & 0x30000) == 0;
    }
    else {
      if (_id != 0) break;
      bVar4 = *(long *)(*(long *)(_o + 8) + 0x298) == 0;
    }
    *(bool *)*_a = !bVar4;
    break;
  case WriteProperty:
    if (_id == 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QWidget::setAttribute((QWidget *)_o,WA_ShowModal,**_a);
        return;
      }
      goto LAB_004d9cc6;
    }
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        setSizeGripEnabled((QDialog *)_o,**_a);
        return;
      }
      goto LAB_004d9cc6;
    }
    break;
  case IndexOfMethod:
    UNRECOVERED_JUMPTABLE = *_a[1];
    lVar1 = *(long *)((long)_a[1] + 8);
    if (UNRECOVERED_JUMPTABLE == finished && lVar1 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (UNRECOVERED_JUMPTABLE == accepted && lVar1 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (UNRECOVERED_JUMPTABLE == rejected && lVar1 == 0) {
      *(undefined4 *)*_a = 2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_004d9cc6:
  __stack_chk_fail();
}

Assistant:

void QDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->accepted(); break;
        case 2: _t->rejected(); break;
        case 3: _t->open(); break;
        case 4: { int _r = _t->exec();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 5: _t->done((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 6: _t->accept(); break;
        case 7: _t->reject(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)(int )>(_a, &QDialog::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)()>(_a, &QDialog::accepted, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialog::*)()>(_a, &QDialog::rejected, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isSizeGripEnabled(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isModal(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSizeGripEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setModal(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}